

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_attr_set_preview(exr_context_t ctxt,int part_index,char *name,exr_attr_preview_t *val)

{
  exr_const_context_t in_RCX;
  undefined8 in_RDX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  exr_attribute_t **in_stack_00000010;
  size_t copybytes;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_result_t rv;
  exr_attribute_t *attr;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 uVar1;
  uint8_t *in_stack_ffffffffffffffa8;
  exr_attr_preview_t *in_stack_ffffffffffffffb0;
  _internal_exr_part *p;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar2;
  exr_attribute_list_t *list;
  undefined4 in_stack_ffffffffffffffe8;
  _internal_exr_context *list_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  exr_result_t eVar3;
  
  uVar1 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  list = (exr_attribute_list_t *)0x0;
  uVar2 = 0;
  if (in_RDI == (_internal_exr_context *)0x0) {
    eVar3 = 2;
  }
  else {
    list_00 = in_RDI;
    internal_exr_lock(in_RDI);
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      internal_exr_unlock(in_RDI);
      eVar3 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else {
      p = in_RDI->parts[(int)in_ESI];
      if (in_RDI->mode == '\0') {
        internal_exr_unlock(in_RDI);
        eVar3 = (*in_RDI->standard_error)(in_RDI,8);
      }
      else if (in_RDI->mode == '\x03') {
        internal_exr_unlock(in_RDI);
        eVar3 = (*in_RDI->standard_error)(in_RDI,0x15);
      }
      else {
        eVar3 = exr_attr_list_find_by_name
                          (in_RCX,list,(char *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),
                           (exr_attribute_t **)in_RDI);
        if (in_RCX == (exr_const_context_t)0x0) {
          internal_exr_unlock(in_RDI);
          eVar3 = (*in_RDI->print_error)
                            (in_RDI,3,"No input value for setting \'%s\', type \'preview\'",in_RDX);
        }
        else {
          if (eVar3 == 0xf) {
            if (in_RDI->mode != '\x01') {
              internal_exr_unlock(in_RDI);
              return eVar3;
            }
            eVar3 = exr_attr_list_add((exr_context_t)
                                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                      (exr_attribute_list_t *)list_00,
                                      (char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                      (exr_attribute_type_t)((ulong)in_RDX >> 0x20),(int32_t)in_RDX,
                                      (uint8_t **)in_RCX,in_stack_00000010);
            if (eVar3 == 0) {
              eVar3 = exr_attr_preview_create
                                ((exr_context_t)in_RDI,(exr_attr_preview_t *)p,
                                 (uint32_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                                 (uint32_t)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
            }
          }
          else if (eVar3 == 0) {
            if (*(int *)((long)&list->sorted_entries + 4) != 0x11) {
              internal_exr_unlock(in_RDI);
              eVar3 = (*in_RDI->print_error)
                                (in_RDI,0x10,
                                 "\'%s\' requested type \'preview\', but attribute is type \'%s\'",
                                 in_RDX,list->entries);
              return eVar3;
            }
            if (((**(int **)(list + 1) == *(int *)in_RCX) &&
                (*(int *)(*(long *)(list + 1) + 4) == *(int *)(in_RCX + 4))) &&
               (*(long *)(*(long *)(list + 1) + 8) != 0)) {
              memcpy(*(void **)(*(long *)(list + 1) + 0x10),*(void **)(in_RCX + 0x10),
                     (ulong)(uint)(*(int *)in_RCX * *(int *)(in_RCX + 4) * 4));
            }
            else {
              if (in_RDI->mode != '\x01') {
                internal_exr_unlock(in_RDI);
                eVar3 = (*in_RDI->print_error)
                                  (in_RDI,0x14,
                                   "Existing preview \'%s\' is %u x %u, requested is %u x %u, unable to change"
                                   ,in_RDX,(ulong)**(uint **)(list + 1),
                                   (ulong)*(uint *)(*(long *)(list + 1) + 4),
                                   CONCAT44(uVar1,*(undefined4 *)in_RCX),*(undefined4 *)(in_RCX + 4)
                                  );
                return eVar3;
              }
              exr_attr_preview_destroy((exr_context_t)p,in_stack_ffffffffffffffb0);
              eVar3 = exr_attr_preview_create
                                ((exr_context_t)in_RDI,(exr_attr_preview_t *)p,
                                 (uint32_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                                 (uint32_t)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
            }
          }
          internal_exr_unlock(in_RDI);
        }
      }
    }
  }
  return eVar3;
}

Assistant:

exr_result_t
exr_attr_set_preview (
    exr_context_t             ctxt,
    int                       part_index,
    const char*               name,
    const exr_attr_preview_t* val)
{
    exr_attribute_t* attr = NULL;
    exr_result_t     rv   = EXR_ERR_SUCCESS;

    EXR_PROMOTE_LOCKED_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (pctxt->mode == EXR_CONTEXT_READ)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_NOT_OPEN_WRITE));
    if (pctxt->mode == EXR_CONTEXT_WRITING_DATA)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_ALREADY_WROTE_ATTRS));

    rv = exr_attr_list_find_by_name (
        ctxt, (exr_attribute_list_t*) &(part->attributes), name, &attr);

    if (!val)
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "No input value for setting '%s', type 'preview'",
            name));

    if (rv == EXR_ERR_NO_ATTR_BY_NAME)
    {
        if (pctxt->mode != EXR_CONTEXT_WRITE)
            return EXR_UNLOCK_AND_RETURN_PCTXT (rv);

        rv = exr_attr_list_add (
            ctxt,
            &(part->attributes),
            name,
            EXR_ATTR_PREVIEW,
            0,
            NULL,
            &(attr));
        if (rv == EXR_ERR_SUCCESS)
            rv = exr_attr_preview_create (
                ctxt, attr->preview, val->width, val->height, val->rgba);
    }
    else if (rv == EXR_ERR_SUCCESS)
    {
        if (attr->type != EXR_ATTR_PREVIEW)
            return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_ATTR_TYPE_MISMATCH,
                "'%s' requested type 'preview', but attribute is type '%s'",
                name,
                attr->type_name));

        if (attr->preview->width == val->width &&
            attr->preview->height == val->height &&
            attr->preview->alloc_size > 0)
        {
            size_t copybytes = val->width * val->height * 4;
            memcpy (
                EXR_CONST_CAST (void*, attr->preview->rgba),
                val->rgba,
                copybytes);
        }
        else if (pctxt->mode != EXR_CONTEXT_WRITE)
        {
            return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_MODIFY_SIZE_CHANGE,
                "Existing preview '%s' is %u x %u, requested is %u x %u, unable to change",
                name,
                attr->preview->width,
                attr->preview->height,
                val->width,
                val->height));
        }
        else
        {
            exr_attr_preview_destroy (ctxt, attr->preview);
            rv = exr_attr_preview_create (
                ctxt, attr->preview, val->width, val->height, val->rgba);
        }
    }
    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}